

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

optional<pbrt::ShapeSample> * __thiscall
pbrt::Triangle::Sample(optional<pbrt::ShapeSample> *__return_storage_ptr__,Triangle *this,Point2f u)

{
  undefined4 uVar1;
  long lVar2;
  undefined8 uVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  Float FVar29;
  undefined1 auVar30 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 local_138 [16];
  Tuple3<pbrt::Point3,_float> local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Tuple3<pbrt::Vector3,_float> local_50;
  Point3fi local_40;
  undefined1 auVar13 [16];
  
  auVar31._8_56_ = in_register_00001208;
  auVar31._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  lVar7 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar10 = *(long *)(lVar7 + 8);
  lVar2 = *(long *)(lVar7 + 0x10);
  lVar5 = (long)this->triIndex;
  lVar6 = (long)*(int *)(lVar10 + lVar5 * 0xc);
  lVar8 = (long)*(int *)(lVar10 + 4 + lVar5 * 0xc);
  fVar38 = *(float *)(lVar2 + 8 + lVar8 * 0xc);
  lVar9 = (long)*(int *)(lVar10 + 8 + lVar5 * 0xc);
  auVar12 = vmovshdup_avx(auVar31._0_16_);
  fVar33 = auVar12._0_4_;
  bVar4 = u.super_Tuple2<pbrt::Point2,_float>.x < fVar33;
  fVar28 = u.super_Tuple2<pbrt::Point2,_float>.x * 0.5;
  auVar12 = vsubss_avx512f(auVar31._0_16_,ZEXT416((uint)(fVar33 * 0.5)));
  auVar27._4_12_ = auVar12._4_12_;
  auVar27._0_4_ = (uint)bVar4 * (int)fVar28 + (uint)!bVar4 * auVar12._0_4_;
  fVar11 = (float)((uint)bVar4 * (int)(fVar33 - fVar28) + (uint)!bVar4 * (int)(fVar33 * 0.5));
  auVar13 = ZEXT416((uint)fVar11);
  auVar12 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar27);
  uVar1 = *(undefined4 *)(lVar2 + 8 + lVar6 * 0xc);
  auVar24._4_4_ = uVar1;
  auVar24._0_4_ = uVar1;
  auVar24._8_4_ = uVar1;
  auVar24._12_4_ = uVar1;
  auVar14 = vsubss_avx512f(auVar12,auVar13);
  auVar15 = vmulss_avx512f(auVar27,auVar24);
  fVar33 = fVar11 * fVar38;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(lVar2 + lVar6 * 0xc);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(lVar2 + lVar8 * 0xc);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(lVar2 + lVar9 * 0xc);
  auVar16 = vbroadcastss_avx512vl(auVar27);
  auVar17 = vmulps_avx512vl(auVar16,auVar23);
  auVar18 = vbroadcastss_avx512vl(auVar13);
  auVar19 = vmulps_avx512vl(auVar18,auVar34);
  auVar20 = vbroadcastss_avx512vl(auVar14);
  auVar21 = vmulps_avx512vl(auVar20,auVar37);
  auVar25 = ZEXT416(*(uint *)(lVar2 + 8 + lVar9 * 0xc));
  auVar22 = vmulss_avx512f(auVar14,auVar25);
  auVar26._0_4_ = auVar21._0_4_ + auVar17._0_4_ + auVar19._0_4_;
  auVar26._4_4_ = auVar21._4_4_ + auVar17._4_4_ + auVar19._4_4_;
  auVar26._8_4_ = auVar21._8_4_ + auVar17._8_4_ + auVar19._8_4_;
  auVar26._12_4_ = auVar21._12_4_ + auVar17._12_4_ + auVar19._12_4_;
  local_118.z = auVar22._0_4_ + auVar15._0_4_ + fVar33;
  local_118._0_8_ = vmovlps_avx(auVar26);
  auVar12 = vinsertps_avx(auVar37,auVar34,0x50);
  auVar26 = vsubps_avx(auVar12,auVar23);
  auVar12 = vinsertps_avx(auVar34,auVar37,0x50);
  auVar23 = vsubps_avx(auVar12,auVar23);
  auVar12 = vinsertps_avx(ZEXT416((uint)fVar38),auVar25,0x10);
  auVar25 = vsubps_avx(auVar12,auVar24);
  auVar12 = vshufps_avx(auVar25,auVar25,0xe1);
  auVar32._0_4_ = auVar23._0_4_ * auVar12._0_4_;
  auVar32._4_4_ = auVar23._4_4_ * auVar12._4_4_;
  auVar32._8_4_ = auVar23._8_4_ * auVar12._8_4_;
  auVar32._12_4_ = auVar23._12_4_ * auVar12._12_4_;
  auVar24 = vfmsub213ps_fma(auVar26,auVar25,auVar32);
  auVar12 = vinsertps_avx(auVar23,auVar25,0x1c);
  auVar25 = vinsertps_avx(auVar23,auVar25,0x4c);
  auVar12 = vfnmadd213ps_fma(auVar25,auVar12,auVar32);
  auVar35._0_4_ = auVar24._0_4_ + auVar12._0_4_;
  auVar35._4_4_ = auVar24._4_4_ + auVar12._4_4_;
  auVar35._8_4_ = auVar24._8_4_ + auVar12._8_4_;
  auVar35._12_4_ = auVar24._12_4_ + auVar12._12_4_;
  auVar12 = vmovshdup_avx(auVar26);
  auVar25 = vmovshdup_avx(auVar23);
  auVar24 = ZEXT416((uint)(auVar12._0_4_ * auVar26._0_4_));
  auVar25 = vfmsub213ss_fma(auVar25,auVar23,auVar24);
  auVar26 = vfnmadd213ss_fma(auVar26,auVar12,auVar24);
  auVar12._0_4_ = auVar35._0_4_ * auVar35._0_4_;
  auVar12._4_4_ = auVar35._4_4_ * auVar35._4_4_;
  auVar12._8_4_ = auVar35._8_4_ * auVar35._8_4_;
  auVar12._12_4_ = auVar35._12_4_ * auVar35._12_4_;
  auVar12 = vhaddps_avx(auVar12,auVar12);
  fVar38 = auVar25._0_4_ + auVar26._0_4_;
  fVar28 = fVar38 * fVar38 + auVar12._0_4_;
  if (fVar28 < 0.0) {
    local_108 = auVar35;
    local_f8 = auVar18;
    local_e8 = auVar16;
    local_d8 = auVar20;
    local_c8 = auVar14;
    local_b8 = auVar27;
    local_a8 = auVar13;
    local_98 = auVar19;
    local_88 = auVar17;
    local_78 = auVar21;
    local_68 = auVar22;
    fVar28 = sqrtf(fVar28);
    auVar27 = local_b8;
    auVar14 = local_c8;
    auVar20 = local_d8;
    auVar16 = local_e8;
    auVar18 = local_f8;
    auVar17 = local_88;
    auVar19 = local_98;
    auVar21 = local_78;
    auVar22 = local_68;
    auVar35 = local_108;
    fVar11 = (float)local_a8._0_4_;
  }
  else {
    auVar12 = vsqrtss_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar28));
    fVar28 = auVar12._0_4_;
  }
  auVar25._4_4_ = fVar28;
  auVar25._0_4_ = fVar28;
  auVar25._8_4_ = fVar28;
  auVar25._12_4_ = fVar28;
  auVar12 = vdivps_avx(auVar35,auVar25);
  fVar38 = fVar38 / fVar28;
  local_138 = vshufps_avx(auVar12,auVar12,0xe1);
  lVar2 = *(long *)(lVar7 + 0x18);
  if (lVar2 == 0) {
    if (*(char *)(lVar7 + 0x38) != *(char *)(lVar7 + 0x39)) {
      auVar12 = vshufps_avx(auVar12,auVar12,0xe1);
      local_138._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
      local_138._8_4_ = auVar12._8_4_ ^ 0x80000000;
      local_138._12_4_ = auVar12._12_4_ ^ 0x80000000;
      fVar38 = -fVar38;
    }
  }
  else {
    lVar7 = (long)*(int *)(lVar10 + lVar5 * 0xc);
    auVar23 = vmulss_avx512f(auVar27,ZEXT416(*(uint *)(lVar2 + lVar7 * 0xc)));
    lVar6 = (long)*(int *)(lVar10 + 4 + lVar5 * 0xc);
    lVar10 = (long)*(int *)(lVar10 + 8 + lVar5 * 0xc);
    auVar24 = vmulss_avx512f(auVar14,ZEXT416(*(uint *)(lVar2 + lVar10 * 0xc)));
    auVar14._8_8_ = 0;
    auVar14._0_8_ = *(ulong *)(lVar2 + 4 + lVar7 * 0xc);
    auVar25 = vmulps_avx512vl(auVar16,auVar14);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = *(ulong *)(lVar2 + 4 + lVar6 * 0xc);
    auVar26 = vmulps_avx512vl(auVar18,auVar16);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = *(ulong *)(lVar2 + 4 + lVar10 * 0xc);
    auVar27 = vmulps_avx512vl(auVar20,auVar18);
    auVar20._0_4_ = auVar25._0_4_ + auVar26._0_4_ + auVar27._0_4_;
    auVar20._4_4_ = auVar25._4_4_ + auVar26._4_4_ + auVar27._4_4_;
    auVar20._8_4_ = auVar25._8_4_ + auVar26._8_4_ + auVar27._8_4_;
    auVar20._12_4_ = auVar25._12_4_ + auVar26._12_4_ + auVar27._12_4_;
    auVar25 = vmovshdup_avx(auVar20);
    fVar28 = fVar38 * auVar25._0_4_;
    auVar36._0_4_ = -fVar28;
    auVar36._4_4_ = 0x80000000;
    auVar36._8_4_ = 0x80000000;
    auVar36._12_4_ = 0x80000000;
    auVar25 = vinsertps_avx(auVar12,ZEXT416((uint)fVar38),0x10);
    auVar26 = vinsertps_avx(ZEXT416((uint)fVar28),auVar36,0x10);
    auVar25 = vfmadd231ps_fma(auVar26,auVar20,auVar25);
    auVar25 = vhaddps_avx(auVar25,auVar25);
    auVar26 = vmovshdup_avx(auVar12);
    auVar25 = vfmadd213ss_fma(auVar26,ZEXT416((uint)(auVar23._0_4_ +
                                                     fVar11 * *(float *)(lVar2 + lVar6 * 0xc) +
                                                    auVar24._0_4_)),auVar25);
    auVar13._0_12_ = ZEXT812(0);
    auVar13._12_4_ = 0;
    if (auVar25._0_4_ < 0.0) {
      auVar12 = vshufps_avx(auVar12,auVar12,0xe1);
      local_138._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
      local_138._8_4_ = auVar12._8_4_ ^ 0x80000000;
      local_138._12_4_ = auVar12._12_4_ ^ 0x80000000;
    }
    uVar3 = vcmpss_avx512f(auVar25,auVar13,1);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar38 = (float)((uint)bVar4 * (int)-fVar38 + (uint)!bVar4 * (int)fVar38);
  }
  auVar30._8_4_ = 0x7fffffff;
  auVar30._0_8_ = 0x7fffffff7fffffff;
  auVar30._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar17,auVar30);
  auVar25 = vandps_avx(auVar15,auVar30);
  auVar26 = vandps_avx(auVar19,auVar30);
  auVar23 = vandps_avx(ZEXT416((uint)fVar33),auVar30);
  auVar24 = vandps_avx(auVar21,auVar30);
  auVar19._0_4_ = auVar12._0_4_ + auVar26._0_4_ + auVar24._0_4_;
  auVar19._4_4_ = auVar12._4_4_ + auVar26._4_4_ + auVar24._4_4_;
  auVar19._8_4_ = auVar12._8_4_ + auVar26._8_4_ + auVar24._8_4_;
  auVar19._12_4_ = auVar12._12_4_ + auVar26._12_4_ + auVar24._12_4_;
  auVar12 = vandps_avx(auVar22,auVar30);
  local_50.z = (auVar25._0_4_ + auVar23._0_4_ + auVar12._0_4_) * 3.57628e-07;
  auVar17._8_4_ = 0x34c00005;
  auVar17._0_8_ = 0x34c0000534c00005;
  auVar17._12_4_ = 0x34c00005;
  auVar12 = vmulps_avx512vl(auVar19,auVar17);
  local_50._0_8_ = vmovlps_avx(auVar12);
  Point3fi::Point3fi(&local_40,(Point3f *)&local_118,(Vector3f *)&local_50);
  *(Interval *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
       local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  (__return_storage_ptr__->optionalValue).__align =
       (anon_struct_8_0_00000001_for___align)
       local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  *(Interval *)((long)&__return_storage_ptr__->optionalValue + 8) =
       local_40.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  FVar29 = Area(this);
  __return_storage_ptr__->set = true;
  auVar21._0_12_ = ZEXT812(0);
  auVar21._12_4_ = 0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x18) = auVar21;
  uVar3 = vmovlps_avx(local_138);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar3;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x30) = fVar38;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x34) = auVar21;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) = auVar21;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 1.0 / FVar29;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(Point2f u) const {
        // Get triangle vertices in _p0_, _p1_, and _p2_
        const TriangleMesh *mesh = GetMesh();
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

        // Sample point on triangle uniformly by area
        pstd::array<Float, 3> b = SampleUniformTriangle(u);
        Point3f p = b[0] * p0 + b[1] * p1 + b[2] * p2;

        // Compute surface normal for sampled point on triangle
        Normal3f n = Normalize(Normal3f(Cross(p1 - p0, p2 - p0)));
        if (mesh->n != nullptr) {
            Normal3f ns(b[0] * mesh->n[v[0]] + b[1] * mesh->n[v[1]] +
                        (1 - b[0] - b[1]) * mesh->n[v[2]]);
            n = FaceForward(n, ns);
        } else if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            n *= -1;

        // Compute error bounds _pError_ for sampled point on triangle
        Point3f pAbsSum = Abs(b[0] * p0) + Abs(b[1] * p1) + Abs((1 - b[0] - b[1]) * p2);
        Vector3f pError = Vector3f(gamma(6) * pAbsSum);

        return ShapeSample{Interaction(Point3fi(p, pError), n), 1 / Area()};
    }